

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_fullscreen.cxx
# Opt level: O0

void __thiscall Fl_Window::fullscreen_screens(Fl_Window *this,int top,int bottom,int left,int right)

{
  int iVar1;
  uint uVar2;
  int right_local;
  int left_local;
  int bottom_local;
  int top_local;
  Fl_Window *this_local;
  
  if ((((top < 0) || (bottom < 0)) || (left < 0)) ||
     (fullscreen_screen_top = top, fullscreen_screen_bottom = bottom, fullscreen_screen_left = left,
     fullscreen_screen_right = right, right < 0)) {
    fullscreen_screen_top = -1;
    fullscreen_screen_bottom = -1;
    fullscreen_screen_left = -1;
    fullscreen_screen_right = -1;
  }
  iVar1 = shown(this);
  if ((iVar1 != 0) && (uVar2 = fullscreen_active(this), uVar2 != 0)) {
    fullscreen_x(this);
  }
  return;
}

Assistant:

void Fl_Window::fullscreen_screens(int top, int bottom, int left, int right) {
  if ((top < 0) || (bottom < 0) || (left < 0) || (right < 0)) {
    fullscreen_screen_top = -1;
    fullscreen_screen_bottom = -1;
    fullscreen_screen_left = -1;
    fullscreen_screen_right = -1;
  } else {
    fullscreen_screen_top = top;
    fullscreen_screen_bottom = bottom;
    fullscreen_screen_left = left;
    fullscreen_screen_right = right;
  }

  if (shown() && fullscreen_active())
    fullscreen_x();
}